

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

int wrapped_fxstat(int vers,int fd,stat *buf)

{
  long lVar1;
  code *pcVar2;
  undefined4 local_60;
  int return_val;
  curious_metadata_record_t io_args;
  curious_file_record_t *record;
  char *mount_point;
  char *filesystem;
  fxstat_f orig_fxstat;
  stat *buf_local;
  int fd_local;
  int vers_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  pcVar2 = (code *)gotcha_get_wrappee(io_fns[0x12].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    io_args._24_8_ = get_curious_file_record(fd);
    if ((curious_file_record_t *)io_args._24_8_ == (curious_file_record_t *)0x0) {
      mount_point = (char *)0x0;
      record = (curious_file_record_t *)0x0;
    }
    else {
      mount_point = ((curious_file_record_t *)io_args._24_8_)->filesystem;
      record = (curious_file_record_t *)((curious_file_record_t *)io_args._24_8_)->mount_point;
    }
    local_60 = 0;
    io_args._0_8_ = mount_point;
    io_args.filesystem = (char *)record;
    io_args.mount_point._0_4_ = 0x12;
    curious_call_callbacks(4,&local_60);
    fd_local = (*pcVar2)(vers,fd,buf);
    local_60 = 1;
    curious_call_callbacks(5,&local_60);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    fd_local = (*pcVar2)(vers,fd,buf);
  }
  return fd_local;
}

Assistant:

int wrapped_fxstat(int vers, int fd, struct stat* buf)
{
    WRAPPER_ENTER(fxstat);

    // Get the handle for the original function
    fxstat_f orig_fxstat = (fxstat_f) gotcha_get_wrappee(io_fns[CURIOUS_FXSTAT_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fd);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .filesystem  = filesystem,
            .mount_point = mount_point,
            .function_id = CURIOUS_FXSTAT_ID,
        };
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_fxstat(vers, fd, buf);
        io_args.call_count = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, fxstat);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_fxstat(vers, fd, buf), fxstat);
    }
}